

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O2

void __thiscall arangodb::velocypack::Dumper::dumpUnicodeCharacter(Dumper *this,uint16_t value)

{
  uint uVar1;
  uint uVar2;
  undefined6 in_register_00000032;
  ulong uVar3;
  
  uVar3 = CONCAT62(in_register_00000032,value);
  (*this->_sink->_vptr_Sink[3])(this->_sink,"\\u",2);
  uVar1 = (uint)(uVar3 >> 0xc) & 0xfffff;
  uVar2 = uVar1 + 0x37;
  if ((ushort)(uVar3 & 0xffffffff) < 0xa000) {
    uVar2 = uVar1 + 0x30;
  }
  (*this->_sink->_vptr_Sink[2])(this->_sink,(ulong)uVar2);
  uVar2 = (uint)(uVar3 >> 8) & 0xf;
  uVar1 = uVar2 + 0x37;
  if ((ushort)uVar2 < 10) {
    uVar1 = uVar2 + 0x30;
  }
  (*this->_sink->_vptr_Sink[2])(this->_sink,(ulong)uVar1);
  uVar2 = (uint)((uVar3 & 0xffffffff) >> 4) & 0xf;
  uVar1 = uVar2 + 0x37;
  if ((ushort)uVar2 < 10) {
    uVar1 = uVar2 + 0x30;
  }
  (*this->_sink->_vptr_Sink[2])(this->_sink,(ulong)uVar1);
  uVar2 = (uint)uVar3 & 0xf;
  uVar1 = uVar2 + 0x37;
  if ((ushort)uVar2 < 10) {
    uVar1 = uVar2 + 0x30;
  }
  (*this->_sink->_vptr_Sink[2])(this->_sink,(ulong)uVar1);
  return;
}

Assistant:

void Dumper::dumpUnicodeCharacter(uint16_t value) {
  _sink->append("\\u", 2);

  uint16_t p;
  p = (value & 0xf000U) >> 12;
  _sink->push_back((p < 10) ? ('0' + p) : ('A' + p - 10));

  p = (value & 0x0f00U) >> 8;
  _sink->push_back((p < 10) ? ('0' + p) : ('A' + p - 10));

  p = (value & 0x00f0U) >> 4;
  _sink->push_back((p < 10) ? ('0' + p) : ('A' + p - 10));

  p = (value & 0x000fU);
  _sink->push_back((p < 10) ? ('0' + p) : ('A' + p - 10));
}